

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

Am_Value same_as_procedure(Am_Object *self)

{
  int iVar1;
  Am_Constraint_Context *pAVar2;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Key_Store_Data *store;
  Am_Object *self_local;
  Am_Value *value;
  
  Am_Value::Am_Value((Am_Value *)self);
  pAVar2 = Am_Object_Advanced::Get_Context();
  iVar1 = (*pAVar2->_vptr_Am_Constraint_Context[6])();
  in_value = Am_Object::Get(in_RSI,*(Am_Slot_Key *)
                                    &((Am_Wrapper *)CONCAT44(extraout_var,iVar1))->field_0xc,0);
  Am_Value::operator=((Am_Value *)self,in_value);
  Am_Wrapper::Release((Am_Wrapper *)CONCAT44(extraout_var,iVar1));
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

static Am_Value
same_as_procedure(Am_Object &self)
{
  Am_Value value;
  Key_Store_Data *store =
      (Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = self.Get(store->key);
  store->Release();
  return value;
}